

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  char *pcVar1;
  ostream *poVar2;
  string *in_RDI;
  ConsoleReporter *unaff_retaddr;
  
  printOpenHeader(unaff_retaddr,in_RDI);
  poVar2 = *(ostream **)((long)&in_RDI->field_2 + 8);
  pcVar1 = getLineOfChars<(char)46>();
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}